

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O2

ssize_t __thiscall phpconvert::ZendParser::write(ZendParser *this,int __fd,void *__buf,size_t __n)

{
  string *__lhs;
  DirectoryReader *pDVar1;
  vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_> *pvVar2;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  File *pFVar3;
  File fileCopy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  File local_168;
  
  *(undefined4 *)__buf = 0;
  local_168.name._M_dataplus._M_p = (pointer)&local_168.name.field_2;
  local_168.name._M_string_length = 0;
  local_168.name.field_2._M_local_buf[0] = '\0';
  local_168.fullPath._M_dataplus._M_p = (pointer)&local_168.fullPath.field_2;
  local_168.fullPath._M_string_length = 0;
  local_168.fullPath.field_2._M_local_buf[0] = '\0';
  local_168.rootPath._M_dataplus._M_p = (pointer)&local_168.rootPath.field_2;
  local_168.rootPath._M_string_length = 0;
  local_168.rootPath.field_2._M_local_buf[0] = '\0';
  local_168.namespaceName._M_dataplus._M_p = (pointer)&local_168.namespaceName.field_2;
  local_168.namespaceName._M_string_length = 0;
  local_168.namespaceName.field_2._M_local_buf[0] = '\0';
  local_168.mainType._M_dataplus._M_p = (pointer)&local_168.mainType.field_2;
  local_168.mainType._M_string_length = 0;
  local_168.mainType.field_2._M_local_buf[0] = '\0';
  local_168.firstMainTypeFull._M_dataplus._M_p = (pointer)&local_168.firstMainTypeFull.field_2;
  local_168.firstMainTypeFull._M_string_length = 0;
  local_168.firstMainTypeFull.field_2._M_local_buf[0] = '\0';
  local_168.content._M_dataplus._M_p = (pointer)&local_168.content.field_2;
  local_168.content._M_string_length = 0;
  local_168.content.field_2._M_local_buf[0] = '\0';
  local_168.prepTypesMain.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.prepTypesMain.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.prepTypes.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.prepTypes.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.prepTypesMain.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.types.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.prepTypes.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.types.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.types.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar2 = this->results;
  __lhs = &(this->super_BaseParser).outputDir;
  for (pFVar3 = (pvVar2->
                super__Vector_base<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pFVar3 != (pvVar2->
                super__Vector_base<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>
                )._M_impl.super__Vector_impl_data._M_finish; pFVar3 = pFVar3 + 1) {
    BaseParser::File::operator=(&local_168,pFVar3);
    pDVar1 = this->reader;
    DirectoryReader::getDirectorySeparator_abi_cxx11_();
    std::operator+(&local_1f8,__lhs,&local_218);
    std::operator+(&local_188,&local_1f8,&pFVar3->rootPath);
    DirectoryReader::createDir(pDVar1,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    replaceTypesBuiltIn(this,&local_168);
    replaceTypesGlobal(this,&local_168);
    addNamespace(this,&local_168);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_1b8,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_register_00000034,__fd));
    addUsages(this,&local_168,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1b8);
    replaceTypes(this,&local_168);
    pDVar1 = this->reader;
    DirectoryReader::getDirectorySeparator_abi_cxx11_();
    std::operator+(&local_218,__lhs,&local_238);
    std::operator+(&local_1f8,&local_218,&local_168.rootPath);
    std::operator+(&local_1d8,&local_1f8,&local_168.name);
    DirectoryReader::writeTextFile(pDVar1,&local_1d8,&local_168.content);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    *(int *)__buf = *__buf + 1;
    pvVar2 = this->results;
  }
  BaseParser::File::~File(&local_168);
  return extraout_RAX;
}

Assistant:

void ZendParser::write(const set<string> &tmpSet, int &generated) {
        generated = 0;
        File fileCopy;
        vector<ZendParser::File>::iterator file;
        for (file = results->begin(); file != results->end(); ++file) {
//            if (file->name.compare("View.php") != 0) {
//                if (file->name.compare("Interface.php") != 0) {
//                    if (file->name.compare("Exception.php") != 0) {
//                        continue;
//                    }
//                }
//            }
//            else if (file->name.compare("Interface.php") != 0) {
//            }
//            else if (file->name.compare("Exception.php") != 0) {
//            }
//            else {
//                continue;
//            }

//		if (file->name.compare("Role.php") != 0) {
//			continue;
//		}
//        if (file->name.compare("Registry.php")) {
//            continue;
//        }
//		if (file->name.compare("Exception.php")!=0) {
//			continue;
//		}
//		if (file->name.compare("Initializer.php")) {
//			continue;
//		}
//		if (file->name.compare("Select.php")) {
//			continue;
//		}
            fileCopy = *file;
            getReader()->createDir(outputDir + DirectoryReader::getDirectorySeparator() + file->rootPath);
            replaceTypesBuiltIn(fileCopy); //@todo problem here
            replaceTypesGlobal(fileCopy);
//		cout << fileCopy.mainType << "\n";
//            if (fileCopy.mainType.length() > 0) {

                addNamespace(fileCopy);
                addUsages(fileCopy, tmpSet);
                replaceTypes(fileCopy);
//            }


            getReader()->writeTextFile(
                    outputDir + DirectoryReader::getDirectorySeparator() + fileCopy.rootPath + fileCopy.name,
                    fileCopy.content);
            generated++;
        }
    }